

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::detail::getTlsOss(bool reset)

{
  long *plVar1;
  string *psVar2;
  ostream *poVar3;
  byte in_DIL;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  if ((in_DIL & 1) != 0) {
    plVar1 = (long *)g_oss_abi_cxx11_();
    std::ios::clear((long)plVar1 + *(long *)(*plVar1 + -0x18),0);
    psVar2 = (string *)g_oss_abi_cxx11_();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::__cxx11::ostringstream::str(psVar2);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  poVar3 = (ostream *)g_oss_abi_cxx11_();
  return poVar3;
}

Assistant:

std::ostream* getTlsOss(bool reset) {
        if(reset) {
          g_oss.clear(); // there shouldn't be anything worth clearing in the flags
          g_oss.str(""); // the slow way of resetting a string stream
          //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
	}
        return &g_oss;
    }